

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reduce.c
# Opt level: O1

size_t mpt_array_reduce(mpt_array *arr)

{
  mpt_buffer *pmVar1;
  size_t sVar2;
  
  pmVar1 = arr->_buf;
  if (pmVar1 == (mpt_buffer *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = pmVar1->_size;
    pmVar1 = (*pmVar1->_vptr->detach)(pmVar1,pmVar1->_used);
    if (pmVar1 != (mpt_buffer *)0x0) {
      arr->_buf = pmVar1;
      sVar2 = pmVar1->_size;
    }
  }
  return sVar2;
}

Assistant:

size_t mpt_array_reduce(MPT_STRUCT(array) *arr)
{
	MPT_STRUCT(buffer) *buf;
	size_t size;
	
	if (!(buf = arr->_buf)) {
		return 0;
	}
	size = buf->_size;
	if (!(buf = buf->_vptr->detach(buf, buf->_used))) {
		return size;
	}
	arr->_buf = buf;
	return buf->_size;
}